

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O0

void __thiscall
QXmlStreamReaderPrivate::raiseError(QXmlStreamReaderPrivate *this,Error error,QString *message)

{
  long lVar1;
  bool bVar2;
  QString *in_RDX;
  int in_ESI;
  QString *in_RDI;
  long in_FS_OFFSET;
  int n;
  undefined4 in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *(int *)&in_RDI[0xf].d.d = in_ESI;
  QString::operator=(in_RDX,in_RDI);
  bVar2 = QString::isNull((QString *)0x641d28);
  if (bVar2) {
    n = (int)((ulong)in_RDI >> 0x20);
    if (in_ESI == 4) {
      QXmlStream::tr((char *)CONCAT44(4,in_stack_ffffffffffffffb8),(char *)in_RDX,n);
      QString::operator=(in_RDX,in_RDI);
      QString::~QString((QString *)0x641d71);
    }
    else if (in_ESI == 2) {
      QXmlStream::tr((char *)CONCAT44(2,in_stack_ffffffffffffffb8),(char *)in_RDX,n);
      QString::operator=(in_RDX,in_RDI);
      QString::~QString((QString *)0x641db3);
    }
  }
  *(undefined4 *)((long)&in_RDI[0xe].d.size + 4) = 1;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QXmlStreamReaderPrivate::raiseError(QXmlStreamReader::Error error, const QString& message)
{
    this->error = error;
    errorString = message;
    if (errorString.isNull()) {
        if (error == QXmlStreamReader::PrematureEndOfDocumentError)
            errorString = QXmlStream::tr("Premature end of document.");
        else if (error == QXmlStreamReader::CustomError)
            errorString = QXmlStream::tr("Invalid document.");
    }

    type = QXmlStreamReader::Invalid;
}